

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<int,_aom_rc_mode,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this,
          ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *base,
          tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
          *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff70;
  ParamGenerator<aom_rc_mode> *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  *in_stack_ffffffffffffff80;
  
  ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_>::ParamIteratorInterface
            (&in_RDI->super_ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_>);
  (in_RDI->super_ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f80bf8;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88caee);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88cb0a);
  ParamGenerator<aom_rc_mode>::begin(in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88cb26);
  ParamGenerator<int>::begin((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_stack_ffffffffffffff80,(ParamIterator<int> *)in_stack_ffffffffffffff78,
             (ParamIterator<aom_rc_mode> *)in_stack_ffffffffffffff70,
             (ParamIterator<int> *)in_stack_ffffffffffffff68);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x88cb5a);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x88cb64);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x88cb6e);
  std::
  get<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88cb89);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  get<1ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88cba5);
  ParamGenerator<aom_rc_mode>::end(in_stack_ffffffffffffff78);
  std::
  get<2ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
              *)0x88cbc1);
  ParamGenerator<int>::end((ParamGenerator<int> *)in_stack_ffffffffffffff78);
  std::
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>,_true,_true>
            (in_stack_ffffffffffffff80,(ParamIterator<int> *)in_stack_ffffffffffffff78,
             (ParamIterator<aom_rc_mode> *)in_stack_ffffffffffffff70,
             (ParamIterator<int> *)in_stack_ffffffffffffff68);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x88cbf5);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x88cbff);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)0x88cc09);
  std::
  tuple<testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>,_testing::internal::ParamIterator<int>_>
  ::tuple(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::shared_ptr<std::tuple<int,_aom_rc_mode,_int>_>::shared_ptr
            ((shared_ptr<std::tuple<int,_aom_rc_mode,_int>_> *)0x88cc60);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }